

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Synch2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *pNew;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  Dch_Pars_t Pars;
  uint local_80;
  uint local_7c;
  Dch_Pars_t local_70;
  
  Dch_ManSetDefaultParams(&local_70);
  local_70.nBTLimit = 100;
  Extra_UtilGetoptReset();
  local_7c = 0x14;
  local_80 = 6;
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"WCSKRfvh"), iVar6 = globalUtilOptind, 0x56 < iVar1) {
      if (iVar1 == 0x76) {
        piVar3 = &local_70.fVerbose;
      }
      else {
        piVar3 = &local_70.fLightSynth;
        if (iVar1 != 0x66) {
          if (iVar1 == 0x57) {
            if (argc <= globalUtilOptind) {
              pcVar4 = "Command line switch \"-W\" should be followed by an integer.\n";
              goto LAB_00222644;
            }
            uVar2 = atoi(argv[globalUtilOptind]);
            local_70.nWords = uVar2;
            goto LAB_0022257f;
          }
          goto LAB_00222650;
        }
      }
      *(byte *)piVar3 = (byte)*piVar3 ^ 1;
    }
    if (iVar1 < 0x4b) {
      if (iVar1 != 0x43) {
        if (iVar1 == -1) {
          if (pAbc->pGia != (Gia_Man_t *)0x0) {
            pNew = Gia_ManAigSynch2(pAbc->pGia,&local_70,local_80,local_7c);
            Abc_FrameUpdateGia(pAbc,pNew);
            return 0;
          }
          pcVar4 = "Abc_CommandAbc9Dch(): There is no AIG.\n";
          iVar6 = -1;
          goto LAB_00222741;
        }
        break;
      }
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
        goto LAB_00222644;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_70.nBTLimit = uVar2;
    }
    else if (iVar1 == 0x53) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-S\" should be followed by an integer.\n";
LAB_00222644:
        Abc_Print(-1,pcVar4);
        break;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_70.nSatVarMax = uVar2;
    }
    else if (iVar1 == 0x4b) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-K\" should be followed by a char string.\n";
        goto LAB_00222644;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_80 = uVar2;
    }
    else {
      if (iVar1 != 0x52) break;
      if (argc <= globalUtilOptind) {
        Abc_Print(1,"Command line switch \"-R\" should be followed by a floating point number.\n");
        return 0;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_7c = uVar2;
    }
LAB_0022257f:
    globalUtilOptind = iVar6 + 1;
  } while (-1 < (int)uVar2);
LAB_00222650:
  Abc_Print(-2,"usage: &synch2 [-WCSKR num] [-fvh]\n");
  Abc_Print(-2,"\t         computes structural choices using a new approach\n");
  Abc_Print(-2,"\t-W num : the max number of simulation words [default = %d]\n",
            (ulong)(uint)local_70.nWords);
  Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
            (ulong)(uint)local_70.nBTLimit);
  Abc_Print(-2,"\t-S num : the max number of SAT variables [default = %d]\n",
            (ulong)(uint)local_70.nSatVarMax);
  Abc_Print(-2,"\t-K num : the target LUT size for downstream mapping [default = %d]\n",
            (ulong)local_80);
  Abc_Print(-2,"\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n",(ulong)local_7c
           );
  pcVar5 = "yes";
  pcVar4 = "yes";
  if (local_70.fLightSynth == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-f     : toggle using lighter logic synthesis [default = %s]\n",pcVar4);
  if (local_70.fVerbose == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar5);
  pcVar4 = "\t-h     : print the command usage\n";
  iVar6 = -2;
LAB_00222741:
  Abc_Print(iVar6,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandAbc9Synch2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManAigSynch2( Gia_Man_t * p, void * pPars, int nLutSize, int nRelaxRatio );
    Gia_Man_t * pTemp;
    Dch_Pars_t Pars, * pPars = &Pars;
    int c, nLutSize = 6;
    int nRelaxRatio = 20;
    // set defaults
    Dch_ManSetDefaultParams( pPars );
    pPars->nBTLimit = 100;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WCSKRfvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nSatVarMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nSatVarMax < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a char string.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by a floating point number.\n" );
                return 0;
            }
            nRelaxRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nRelaxRatio < 0 ) 
                goto usage;
            break;
        case 'f':
            pPars->fLightSynth ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Dch(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Gia_ManAigSynch2( pAbc->pGia, pPars, nLutSize, nRelaxRatio );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &synch2 [-WCSKR num] [-fvh]\n" );
    Abc_Print( -2, "\t         computes structural choices using a new approach\n" );
    Abc_Print( -2, "\t-W num : the max number of simulation words [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-S num : the max number of SAT variables [default = %d]\n", pPars->nSatVarMax );
    Abc_Print( -2, "\t-K num : the target LUT size for downstream mapping [default = %d]\n", nLutSize );
    Abc_Print( -2, "\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n",   nRelaxRatio );
    Abc_Print( -2, "\t-f     : toggle using lighter logic synthesis [default = %s]\n", pPars->fLightSynth? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}